

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O3

CURLcode Curl_mime_duppart(Curl_easy *data,curl_mimepart *dst,curl_mimepart *src)

{
  curl_off_t cVar1;
  curl_read_callback p_Var2;
  void *pvVar3;
  curl_seek_callback p_Var4;
  curl_free_callback p_Var5;
  CURLcode CVar6;
  CURLcode CVar7;
  curl_mimepart *subparts;
  curl_mimepart *dst_00;
  curl_mimepart *pcVar8;
  curl_slist *headers;
  char *pcVar9;
  curl_mimepart *src_00;
  
  CVar7 = CURLE_BAD_FUNCTION_ARGUMENT;
  switch(src->kind) {
  case MIMEKIND_NONE:
    break;
  case MIMEKIND_DATA:
    CVar6 = curl_mime_data(dst,src->data,src->datasize);
    goto LAB_0014050a;
  case MIMEKIND_FILE:
    CVar6 = curl_mime_filedata(dst,src->data);
    if (CVar6 != CURLE_READ_ERROR) goto LAB_0014050a;
    break;
  case MIMEKIND_CALLBACK:
    if (dst == (curl_mimepart *)0x0) goto switchD_00140418_default;
    cVar1 = src->datasize;
    p_Var2 = src->readfunc;
    p_Var4 = src->seekfunc;
    p_Var5 = src->freefunc;
    pvVar3 = src->arg;
    cleanup_part_content(dst);
    if (p_Var2 != (curl_read_callback)0x0) {
      dst->readfunc = p_Var2;
      dst->seekfunc = p_Var4;
      dst->freefunc = p_Var5;
      dst->arg = pvVar3;
      dst->datasize = cVar1;
      dst->kind = MIMEKIND_CALLBACK;
    }
    break;
  case MIMEKIND_MULTIPART:
    subparts = (curl_mimepart *)curl_mime_init(data);
    CVar7 = CURLE_OUT_OF_MEMORY;
    if (subparts == (curl_mimepart *)0x0) goto switchD_00140418_default;
    CVar6 = Curl_mime_set_subparts(dst,(curl_mime *)subparts,1);
    src_00 = *(curl_mimepart **)((long)src->arg + 8);
    if (src_00 != (curl_mimepart *)0x0 && CVar6 == CURLE_OK) {
      do {
        dst_00 = (curl_mimepart *)(*Curl_cmalloc)(0x1b8);
        if (dst_00 == (curl_mimepart *)0x0) goto switchD_00140418_default;
        memset(&dst_00->nextpart,0,0x1a8);
        dst_00->lastreadstatus = 1;
        (dst_00->state).ptr = (void *)0x0;
        (dst_00->state).offset = 0;
        dst_00->parent = (curl_mime *)subparts;
        pcVar8 = *(curl_mimepart **)&subparts->kind;
        if (*(curl_mimepart **)&subparts->kind == (curl_mimepart *)0x0) {
          pcVar8 = subparts;
        }
        pcVar8->nextpart = dst_00;
        *(curl_mimepart **)&subparts->kind = dst_00;
        CVar6 = Curl_mime_duppart(data,dst_00,src_00);
      } while ((CVar6 == CURLE_OK) && (src_00 = src_00->nextpart, src_00 != (curl_mimepart *)0x0));
    }
LAB_0014050a:
    CVar7 = CVar6;
    if (CVar6 != CURLE_OK) goto switchD_00140418_default;
    break;
  default:
    goto switchD_00140418_default;
  }
  if (src->userheaders == (curl_slist *)0x0) {
LAB_0014059f:
    dst->encoder = src->encoder;
    pcVar9 = src->mimetype;
    (*Curl_cfree)(dst->mimetype);
    dst->mimetype = (char *)0x0;
    if (pcVar9 != (char *)0x0) {
      pcVar9 = (*Curl_cstrdup)(pcVar9);
      dst->mimetype = pcVar9;
      if (pcVar9 == (char *)0x0) goto LAB_0014063d;
    }
    pcVar9 = src->name;
    (*Curl_cfree)(dst->name);
    dst->name = (char *)0x0;
    if (pcVar9 != (char *)0x0) {
      pcVar9 = (*Curl_cstrdup)(pcVar9);
      dst->name = pcVar9;
      if (pcVar9 == (char *)0x0) goto LAB_0014063d;
    }
    pcVar9 = src->filename;
    (*Curl_cfree)(dst->filename);
    dst->filename = (char *)0x0;
    if (pcVar9 == (char *)0x0) {
      return CURLE_OK;
    }
    pcVar9 = (*Curl_cstrdup)(pcVar9);
    dst->filename = pcVar9;
    if (pcVar9 != (char *)0x0) {
      return CURLE_OK;
    }
  }
  else {
    headers = Curl_slist_duplicate(src->userheaders);
    if (headers != (curl_slist *)0x0) {
      CVar7 = curl_mime_headers(dst,headers,1);
      if (CVar7 != CURLE_OK) {
        curl_slist_free_all(headers);
        goto switchD_00140418_default;
      }
      goto LAB_0014059f;
    }
  }
LAB_0014063d:
  CVar7 = CURLE_OUT_OF_MEMORY;
switchD_00140418_default:
  Curl_mime_cleanpart(dst);
  return CVar7;
}

Assistant:

CURLcode Curl_mime_duppart(struct Curl_easy *data,
                           curl_mimepart *dst, const curl_mimepart *src)
{
  curl_mime *mime;
  curl_mimepart *d;
  const curl_mimepart *s;
  CURLcode res = CURLE_OK;

  DEBUGASSERT(dst);

  /* Duplicate content. */
  switch(src->kind) {
  case MIMEKIND_NONE:
    break;
  case MIMEKIND_DATA:
    res = curl_mime_data(dst, src->data, (size_t) src->datasize);
    break;
  case MIMEKIND_FILE:
    res = curl_mime_filedata(dst, src->data);
    /* Do not abort duplication if file is not readable. */
    if(res == CURLE_READ_ERROR)
      res = CURLE_OK;
    break;
  case MIMEKIND_CALLBACK:
    res = curl_mime_data_cb(dst, src->datasize, src->readfunc,
                            src->seekfunc, src->freefunc, src->arg);
    break;
  case MIMEKIND_MULTIPART:
    /* No one knows about the cloned subparts, thus always attach ownership
       to the part. */
    mime = curl_mime_init(data);
    res = mime ? curl_mime_subparts(dst, mime) : CURLE_OUT_OF_MEMORY;

    /* Duplicate subparts. */
    for(s = ((curl_mime *) src->arg)->firstpart; !res && s; s = s->nextpart) {
      d = curl_mime_addpart(mime);
      res = d ? Curl_mime_duppart(data, d, s) : CURLE_OUT_OF_MEMORY;
    }
    break;
  default:  /* Invalid kind: should not occur. */
    DEBUGF(infof(data, "invalid MIMEKIND* attempt"));
    res = CURLE_BAD_FUNCTION_ARGUMENT;  /* Internal error? */
    break;
  }

  /* Duplicate headers. */
  if(!res && src->userheaders) {
    struct curl_slist *hdrs = Curl_slist_duplicate(src->userheaders);

    if(!hdrs)
      res = CURLE_OUT_OF_MEMORY;
    else {
      /* No one but this procedure knows about the new header list,
         so always take ownership. */
      res = curl_mime_headers(dst, hdrs, TRUE);
      if(res)
        curl_slist_free_all(hdrs);
    }
  }

  if(!res) {
    /* Duplicate other fields. */
    dst->encoder = src->encoder;
    res = curl_mime_type(dst, src->mimetype);
  }
  if(!res)
    res = curl_mime_name(dst, src->name);
  if(!res)
    res = curl_mime_filename(dst, src->filename);

  /* If an error occurred, rollback. */
  if(res)
    Curl_mime_cleanpart(dst);

  return res;
}